

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetArrayType
          (InterfaceVariableScalarReplacement *this,uint32_t elem_type_id,uint32_t array_length)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  Type *type;
  Array array_type;
  LengthInfo local_98;
  Array local_78;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  type = analysis::TypeManager::GetType
                   ((pIVar1->type_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                    _M_head_impl,elem_type_id);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(pIVar1);
  }
  local_98.id = analysis::ConstantManager::GetUIntConstId
                          ((pIVar1->constant_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>
                           ._M_head_impl,array_length);
  local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *(ulong *)local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (ulong)array_length << 0x20;
  local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  analysis::Array::Array(&local_78,type,&local_98);
  if (local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.words.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.words.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  uVar2 = analysis::TypeManager::GetTypeInstruction
                    ((pIVar1->type_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                     _M_head_impl,&local_78.super_Type);
  local_78.super_Type._vptr_Type = (_func_int **)&PTR__Array_0094bb10;
  if (local_78.length_info_.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.length_info_.words.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.length_info_.words.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.length_info_.words.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_78.super_Type._vptr_Type = (_func_int **)&PTR__Type_00948bd0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_78.super_Type.decorations_);
  return uVar2;
}

Assistant:

uint32_t InterfaceVariableScalarReplacement::GetArrayType(
    uint32_t elem_type_id, uint32_t array_length) {
  analysis::Type* elem_type = context()->get_type_mgr()->GetType(elem_type_id);
  uint32_t array_length_id =
      context()->get_constant_mgr()->GetUIntConstId(array_length);
  analysis::Array array_type(
      elem_type,
      analysis::Array::LengthInfo{array_length_id, {0, array_length}});
  return context()->get_type_mgr()->GetTypeInstruction(&array_type);
}